

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

bool CNscPStackEntry::TestConstantEquality
               (uchar *pauchData1,size_t nDataSize1,uchar *pauchData2,size_t nDataSize2)

{
  int iVar1;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  NscPCodeConstantVector *p2_4;
  NscPCodeConstantVector *p1_4;
  NscPCodeConstantObject *p2_3;
  NscPCodeConstantObject *p1_3;
  NscPCodeConstantString *p2_2;
  NscPCodeConstantString *p1_2;
  NscPCodeConstantFloat *p2_1;
  NscPCodeConstantFloat *p1_1;
  NscPCodeConstantInteger *p2;
  NscPCodeConstantInteger *p1;
  NscPCodeHeader *ph2;
  NscPCodeHeader *ph1;
  bool local_92;
  bool local_91;
  bool local_1;
  
  if ((in_RSI == 0) && (in_RCX == 0)) {
    local_1 = true;
  }
  else if ((in_RSI == 0) && (in_RCX != 0)) {
    local_1 = false;
  }
  else if ((in_RCX == 0) && (in_RSI != 0)) {
    local_1 = false;
  }
  else {
    if (*in_RDI != in_RSI) {
      __assert_fail("ph1 ->nOpSize == nDataSize1",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1eb,
                    "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                   );
    }
    if (*in_RDX != in_RCX) {
      __assert_fail("ph2 ->nOpSize == nDataSize2",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1ec,
                    "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                   );
    }
    if ((int)in_RDI[1] != 0x34) {
      __assert_fail("ph1 ->nOpCode == NscPCode_Constant",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1ed,
                    "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                   );
    }
    if ((int)in_RDX[1] != 0x34) {
      __assert_fail("ph2 ->nOpCode == NscPCode_Constant",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1ee,
                    "static bool CNscPStackEntry::TestConstantEquality(const unsigned char *, size_t, const unsigned char *, size_t)"
                   );
    }
    if (*(int *)((long)in_RDI + 0xc) == *(int *)((long)in_RDX + 0xc)) {
      switch(*(undefined4 *)((long)in_RDI + 0xc)) {
      case 6:
        local_1 = (int)in_RDI[2] == (int)in_RDX[2];
        break;
      case 7:
        local_1 = ABS(*(float *)(in_RDI + 2) - *(float *)(in_RDX + 2)) < 1e-05;
        break;
      case 8:
        local_91 = false;
        if (in_RDI[2] == in_RDX[2]) {
          iVar1 = memcmp(in_RDI + 3,in_RDX + 3,in_RDI[2]);
          local_91 = iVar1 == 0;
        }
        local_1 = local_91;
        break;
      case 9:
        local_1 = (int)in_RDI[2] == (int)in_RDX[2];
        break;
      case 10:
        local_92 = false;
        if ((ABS(*(float *)(in_RDI + 2) - *(float *)(in_RDX + 2)) < 1e-05) &&
           (local_92 = false,
           ABS(*(float *)((long)in_RDI + 0x14) - *(float *)((long)in_RDX + 0x14)) < 1e-05)) {
          local_92 = ABS(*(float *)(in_RDI + 3) - *(float *)(in_RDX + 3)) < 1e-05;
        }
        local_1 = local_92;
        break;
      default:
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool TestConstantEquality(const unsigned char *pauchData1, size_t nDataSize1,
		const unsigned char *pauchData2, size_t nDataSize2)
	{
		const NscPCodeHeader *ph1 = (const NscPCodeHeader *) pauchData1;
		const NscPCodeHeader *ph2 = (const NscPCodeHeader *) pauchData2;

		if (nDataSize1 == 0 && nDataSize2 == 0)
			return true;
		else if (nDataSize1 == 0 && nDataSize2 != 0)
			return false;
		else if (nDataSize2 == 0 && nDataSize1 != 0)
			return false;

		assert (ph1 ->nOpSize == nDataSize1);
		assert (ph2 ->nOpSize == nDataSize2);
		assert (ph1 ->nOpCode == NscPCode_Constant);
		assert (ph2 ->nOpCode == NscPCode_Constant);

		if (ph1 ->nType != ph2 ->nType)
			return false;

		switch (ph1 ->nType)
		{

		case NscType_Integer:
			{
				const NscPCodeConstantInteger *p1 = (const NscPCodeConstantInteger *) ph1;
				const NscPCodeConstantInteger *p2 = (const NscPCodeConstantInteger *) ph2;

				return (p1 ->lValue == p2 ->lValue);
			}

		case NscType_Float:
			{
				const NscPCodeConstantFloat *p1 = (const NscPCodeConstantFloat *) ph1;
				const NscPCodeConstantFloat *p2 = (const NscPCodeConstantFloat *) ph2;

				return fabs (p1 ->fValue - p2 ->fValue) < 0.00001f;
			}

		case NscType_String:
			{
				const NscPCodeConstantString *p1 = (const NscPCodeConstantString *) ph1;
				const NscPCodeConstantString *p2 = (const NscPCodeConstantString *) ph2;

				return (p1 ->nLength == p2 ->nLength &&
				        memcmp (p1 ->szString, p2 ->szString, p1 ->nLength) == 0);
			}

		case NscType_Object:
			{
				const NscPCodeConstantObject *p1 = (const NscPCodeConstantObject *) ph1;
				const NscPCodeConstantObject *p2 = (const NscPCodeConstantObject *) ph2;

				return (p1 ->ulid == p2 ->ulid);
			}

		case NscType_Vector:
			{
				const NscPCodeConstantVector *p1 = (const NscPCodeConstantVector *) ph1;
				const NscPCodeConstantVector *p2 = (const NscPCodeConstantVector *) ph2;

				return fabs (p1 ->v [0] - p2 ->v [0]) < 0.00001f &&
				       fabs (p1 ->v [1] - p2 ->v [1]) < 0.00001f &&
				       fabs (p1 ->v [2] - p2 ->v [2]) < 0.00001f;
			}

		default:
			//
			// Structure types, or others without value initializers.
			//

			return true;

		}
	}